

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O0

void kj::anon_unknown_6::registerSignalHandler(int signum)

{
  int iVar1;
  void *pvVar2;
  Fault local_e8;
  Fault f_2;
  SyscallResult local_d4;
  SyscallResult _kjSyscallResult_2;
  Fault f_1;
  SyscallResult local_b8 [2];
  SyscallResult _kjSyscallResult_1;
  Fault local_a8;
  Fault f;
  SyscallResult local_94;
  undefined1 local_90 [4];
  SyscallResult _kjSyscallResult;
  sigset_t mask;
  int signum_local;
  
  (anonymous_namespace)::tooLateToSetReserved = 1;
  f.exception = (Exception *)local_90;
  local_94 = kj::_::Debug::syscall<kj::(anonymous_namespace)::registerSignalHandler(int)::__0>
                       ((anon_class_8_1_898eb3ea *)&f,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_94);
  if (pvVar2 == (void *)0x0) {
    iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_94);
    kj::_::Debug::Fault::Fault
              (&local_a8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x56,iVar1,"sigemptyset(&mask)","");
    kj::_::Debug::Fault::fatal(&local_a8);
  }
  f_1.exception = (Exception *)local_90;
  local_b8[0] = kj::_::Debug::syscall<kj::(anonymous_namespace)::registerSignalHandler(int)::__1>
                          ((anon_class_16_2_52aa9282 *)&f_1,false);
  pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(local_b8);
  if (pvVar2 != (void *)0x0) {
    f_2.exception = (Exception *)local_90;
    local_d4 = kj::_::Debug::syscall<kj::(anonymous_namespace)::registerSignalHandler(int)::__2>
                         ((anon_class_8_1_898eb3ea *)&f_2,false);
    pvVar2 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_d4);
    if (pvVar2 != (void *)0x0) {
      return;
    }
    iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(&local_d4);
    kj::_::Debug::Fault::Fault
              (&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
               ,0x58,iVar1,"sigprocmask(SIG_BLOCK, &mask, nullptr)","");
    kj::_::Debug::Fault::fatal(&local_e8);
  }
  iVar1 = kj::_::Debug::SyscallResult::getErrorNumber(local_b8);
  kj::_::Debug::Fault::Fault
            ((Fault *)&stack0xffffffffffffff30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
             ,0x57,iVar1,"sigaddset(&mask, signum)","");
  kj::_::Debug::Fault::fatal((Fault *)&stack0xffffffffffffff30);
}

Assistant:

void registerSignalHandler(int signum) {
  tooLateToSetReserved = true;

  sigset_t mask;
  KJ_SYSCALL(sigemptyset(&mask));
  KJ_SYSCALL(sigaddset(&mask, signum));
  KJ_SYSCALL(sigprocmask(SIG_BLOCK, &mask, nullptr));

#if !KJ_USE_EPOLL  // on Linux we'll use signalfd
  struct sigaction action;
  memset(&action, 0, sizeof(action));
  action.sa_sigaction = &signalHandler;
  KJ_SYSCALL(sigfillset(&action.sa_mask));
  action.sa_flags = SA_SIGINFO;
  KJ_SYSCALL(sigaction(signum, &action, nullptr));
#endif
}